

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

ON_SubDEdgePtr ON_SubDEdgePtr::CreateFromStartVertex(ON_SubDEdge *edge,ON_SubDVertex *start_vertex)

{
  if (start_vertex != (ON_SubDVertex *)0x0 && edge != (ON_SubDEdge *)0x0) {
    if (edge->m_vertex[0] != edge->m_vertex[1]) {
      if (edge->m_vertex[0] != start_vertex) {
        if (edge->m_vertex[1] != start_vertex) {
          return (ON_SubDEdgePtr)0;
        }
        edge = (ON_SubDEdge *)((ulong)edge | 1);
      }
      return (ON_SubDEdgePtr)edge;
    }
  }
  return (ON_SubDEdgePtr)0;
}

Assistant:

const ON_SubDEdgePtr ON_SubDEdgePtr::CreateFromStartVertex(
  const class ON_SubDEdge* edge,
  const ON_SubDVertex* start_vertex
)
{
  for (;;)
  {
    if (nullptr == edge || nullptr == start_vertex)
      break;
    if (edge->m_vertex[0] == edge->m_vertex[1])
      break;
    
    ON__UINT_PTR dir;
    if (start_vertex == edge->m_vertex[0])
      dir = 0;
    else if (start_vertex == edge->m_vertex[1])
      dir = 1;
    else
      break;
    return ON_SubDEdgePtr::Create(edge, dir);
  }
  return ON_SubDEdgePtr::Null;
}